

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O1

Object * __thiscall
nvim::NvimRPC::
do_call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
          (Object *__return_storage_ptr__,NvimRPC *this,string *method,long *u,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_1,
          basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
          *u_2)

{
  ulong uVar1;
  undefined1 uVar2;
  uint16_t val;
  long *__n;
  size_t __n_00;
  basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
  *__n_01;
  Packer pk;
  unpacked result;
  sbuffer sbuf;
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  dst;
  packer<msgpack::v1::sbuffer> local_f8;
  convert<msgpack::v1::type::tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>,_void>
  local_e9;
  basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
  *local_e8;
  undefined1 local_e0 [24];
  __uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> local_c8;
  sbuffer local_c0;
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  local_a8;
  object local_48;
  
  __n = u;
  local_e8 = u_2;
  msgpack::v1::sbuffer::sbuffer(&local_c0,0x2000);
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0x94;
  local_f8.m_stream = &local_c0;
  msgpack::v1::sbuffer::write(&local_c0,(int)&local_a8,(void *)0x1,(size_t)__n);
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0;
  msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x1,(size_t)__n);
  uVar1 = this->msgid_;
  __n_00 = uVar1 + 1;
  this->msgid_ = __n_00;
  uVar2 = (undefined1)uVar1;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x80) {
      local_a8.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = uVar2;
      msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x1,__n_00);
    }
    else {
      local_a8.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xcc;
      local_a8.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = uVar2;
      msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x2,__n_00);
    }
  }
  else {
    local_a8.
    super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
    ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = (undefined1)(uVar1 >> 8);
    if (uVar1 < 0x10000) {
      local_a8.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xcd;
      local_a8.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = uVar2;
      msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x3,__n_00);
    }
    else {
      __n_00 = uVar1 >> 0x20;
      if (__n_00 == 0) {
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xce;
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = (undefined1)(uVar1 >> 0x10);
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._3_1_ =
             local_a8.
             super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
             ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_;
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = (undefined1)(uVar1 >> 0x18);
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>._4_1_ = uVar2;
        msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x5,0);
      }
      else {
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xcf;
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = (undefined1)(uVar1 >> 0x30);
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._3_1_ = (undefined1)(uVar1 >> 0x28);
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>._4_1_ = SUB81(uVar1 >> 0x20,0);
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>._5_4_ =
             (uint)(uVar1 >> 0x18) & 0xff | (uint)(uVar1 >> 8) & 0xff00 |
             (uint)(((uVar1 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar1 << 0x38) >> 0x20);
        local_a8.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = (undefined1)(uVar1 >> 0x38);
        msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x9,__n_00);
      }
    }
  }
  msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()(&local_a8,&local_f8,method);
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0x93;
  msgpack::v1::sbuffer::write(local_f8.m_stream,(int)&local_a8,(void *)0x1,__n_00);
  __n_01 = local_e8;
  detail::
  pack<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&local_f8,u,u_1,local_e8);
  Socket::write(&this->socket_,(int)local_c0.m_data,(void *)local_c0.m_size,(size_t)__n_01);
  Socket::read2((unpacked *)local_e0,&this->socket_,5.0);
  local_48.via.array.ptr = (object *)local_e0._16_8_;
  local_48._0_8_ = local_e0._0_8_;
  local_48.via.u64 = local_e0._8_8_;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = 0;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = 0;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._3_1_ = 0;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_ = 0;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<1UL,_long,_false>._M_head_impl = 0;
  local_a8.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<0UL,_long,_false>._M_head_impl = 0;
  msgpack::v1::adaptor::
  convert<msgpack::v1::type::tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>,_void>
  ::operator()(&local_e9,(object *)&local_48,&local_a8);
  boost::variant<$cf2d41c5$>::variant
            (&__return_storage_ptr__->super_variant<_cf2d41c5_>,(variant<_cf2d41c5_> *)&local_a8);
  boost::variant<$cf2d41c5$>::destroy_content
            ((variant<_cf2d41c5_> *)
             &local_a8.
              super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Head_base<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
            );
  boost::variant<$cf2d41c5$>::destroy_content((variant<_cf2d41c5_> *)&local_a8);
  if ((_Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>)
      local_c8._M_t.
      super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
      super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl != (zone *)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&local_c8,
               (zone *)local_c8._M_t.
                       super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                       .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl);
  }
  free(local_c0.m_data);
  return __return_storage_ptr__;
}

Assistant:

Object NvimRPC::do_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    // msgpack::object_handle oh = msgpack::unpack(sbuf.data(), sbuf.size());
    // msgpack::object deserialized = oh.get();
    // std::cout << "sbuf = " << deserialized << std::endl;

    socket_.write(sbuf.data(), sbuf.size(), 5);

    msgpack::unpacked result = socket_.read2(5);
    msgpack::object obj(result.get());

    //TODO: full-state response handler should be implemented

    // std::cout << "res = " << obj << std::endl;
    msgpack::type::tuple<int64_t, int64_t, Object, Object> dst;
    // [type=1, msgid(uint), error(str?), result(...)]
    obj.convert(dst);
    return dst.get<3>();
}